

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdPrecompute4Vars(void)

{
  int iVar1;
  char *pcVar2;
  Kit_DsdNtk_t *p;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdMan_t *p_00;
  uint *pIn1;
  ulong uVar3;
  uint local_148;
  uint uTruth;
  FILE *local_140;
  char Buffer [256];
  
  local_140 = fopen("5npn/npn4.txt","r");
  uVar3 = 0;
  local_148 = 0;
  while( true ) {
    pcVar2 = fgets(Buffer,100,local_140);
    if (pcVar2 == (char *)0x0) break;
    Buffer[6] = '\0';
    Extra_ReadHexadecimal(&uTruth,Buffer + 2,4);
    uTruth = (uTruth & 0xffff) * 0x10001;
    p = Kit_DsdDecompose(&uTruth,4);
    pNtk = Kit_DsdExpand(p);
    Kit_DsdNtkFree(p);
    iVar1 = Kit_DsdFindLargeBox(pNtk,3);
    if (iVar1 != 0) {
      Kit_DsdTestCofs(pNtk,&uTruth);
      putchar(10);
      printf("%3d : Non-DSD function  %s  %s\n",uVar3,Buffer + 2,"");
      Kit_DsdPrint(_stdout,pNtk);
      putchar(10);
      local_148 = local_148 + 1;
    }
    p_00 = Kit_DsdManAlloc(4,(uint)pNtk->nNodes + (uint)pNtk->nVars);
    pIn1 = Kit_DsdTruthCompute(p_00,pNtk);
    iVar1 = Extra_TruthIsEqual(&uTruth,pIn1,4);
    if (iVar1 == 0) {
      puts("Verification failed.");
    }
    Kit_DsdManFree(p_00);
    Kit_DsdNtkFree(pNtk);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  fclose(local_140);
  printf("non-DSD = %d   implementable = %d\n",(ulong)local_148,0);
  return;
}

Assistant:

void Kit_DsdPrecompute4Vars()
{
    Kit_DsdMan_t * p;
    Kit_DsdNtk_t * pNtk, * pTemp;
    FILE * pFile;
    unsigned uTruth;
    unsigned * pTruthC;
    char Buffer[256];
    int i, RetValue;
    int Counter1 = 0, Counter2 = 0;

    pFile = fopen( "5npn/npn4.txt", "r" );
    for ( i = 0; fgets( Buffer, 100, pFile ); i++ )
    {
        Buffer[6] = 0;
        Extra_ReadHexadecimal( &uTruth, Buffer+2, 4 );
        uTruth = ((uTruth & 0xffff) << 16) | (uTruth & 0xffff);
        pNtk = Kit_DsdDecompose( &uTruth, 4 );

        pNtk = Kit_DsdExpand( pTemp = pNtk );
        Kit_DsdNtkFree( pTemp );


        if ( Kit_DsdFindLargeBox(pNtk, 3) )
        {
//            RetValue = 0;
            RetValue = Kit_DsdTestCofs( pNtk, &uTruth );
            printf( "\n" );
            printf( "%3d : Non-DSD function  %s  %s\n", i, Buffer + 2, RetValue? "implementable" : "" );
            Kit_DsdPrint( stdout, pNtk ), printf( "\n" );

            Counter1++;
            Counter2 += RetValue;
        }

/*
        printf( "%3d : Function  %s   ", i, Buffer + 2 );
        if ( !Kit_DsdFindLargeBox(pNtk, 3) )
            Kit_DsdPrint( stdout, pNtk );
        else
            printf( "\n" );
*/

        p = Kit_DsdManAlloc( 4, Kit_DsdNtkObjNum(pNtk) );
        pTruthC = Kit_DsdTruthCompute( p, pNtk );
        if ( !Extra_TruthIsEqual( &uTruth, pTruthC, 4 ) )
            printf( "Verification failed.\n" );
        Kit_DsdManFree( p );

        Kit_DsdNtkFree( pNtk );
    }
    fclose( pFile );
    printf( "non-DSD = %d   implementable = %d\n", Counter1, Counter2 );
}